

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsMetaDataSetIntegers
              (FmsMetaData mdata,char *mdata_name,FmsIntType int_type,FmsInt size,void **data)

{
  int iVar1;
  int iVar2;
  void *__ptr;
  
  if (mdata == (FmsMetaData)0x0) {
    iVar1 = 1;
  }
  else if (int_type < FMS_NUM_INT_TYPES) {
    if (size == 0 || data != (void **)0x0) {
      iVar1 = FmsMetaDataClear(mdata);
      if (iVar1 == 0) {
        iVar1 = 4;
        if (size == 0) {
          __ptr = (void *)0x0;
        }
        else {
          __ptr = malloc(FmsIntTypeSize[int_type] * size);
          if (__ptr == (void *)0x0) {
            return 4;
          }
        }
        iVar2 = FmsCopyString(mdata_name,&mdata->name);
        if (iVar2 == 0) {
          mdata->md_type = FMS_INTEGER;
          (mdata->sub_type).int_type = int_type;
          mdata->num_entries = size;
          mdata->data = __ptr;
          *data = __ptr;
          iVar1 = 0;
        }
        else {
          free(__ptr);
        }
      }
    }
    else {
      iVar1 = 3;
    }
  }
  else {
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

int FmsMetaDataSetIntegers(FmsMetaData mdata, const char *mdata_name,
                           FmsIntType int_type, FmsInt size, void **data) {
  if (!mdata) { E_RETURN(1); }
  if (int_type >= FMS_NUM_INT_TYPES) { E_RETURN(2); }
  if (size && !data) { E_RETURN(3); }
  int err = FmsMetaDataClear(mdata);
  if (err) { E_RETURN(err); }
  const size_t sizeof_int_type = FmsIntTypeSize[int_type];
  void *md_data = size ? malloc(size*sizeof_int_type) : NULL;
  if (size && md_data == NULL) { E_RETURN(4); }
  // On error, call free(md_data)
  // Update mdata
  if (FmsCopyString(mdata_name, &mdata->name)) { free(md_data); E_RETURN(4); }
  mdata->md_type = FMS_INTEGER;
  mdata->sub_type.int_type = int_type;
  mdata->num_entries = size;
  mdata->data = md_data;
  *data = md_data;
  return 0;
}